

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O2

bool __thiscall QSharedMemory::lock(QSharedMemory *this)

{
  QObjectData *pQVar1;
  QObject **ppQVar2;
  QObject *pQVar3;
  Data *pDVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QLatin1String local_58;
  QMessageLogger local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].field_0x30 == '\x01') {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context.line = 0;
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QSharedMemory::lock: already locked");
  }
  else {
    bVar5 = QSystemSemaphore::acquire((QSystemSemaphore *)&pQVar1[2].children.d.size);
    if (!bVar5) {
      local_58.m_size = 0x13;
      local_58.m_data = "QSharedMemory::lock";
      tr((QString *)&local_70,"%1: unable to lock",(char *)0x0,-1);
      QString::arg<QLatin1String,_true>
                ((QString *)&local_48,(QString *)&local_70,&local_58,0,(QChar)0x20);
      pQVar3 = pQVar1[2].parent;
      pDVar4 = pQVar1[2].children.d.d;
      pQVar1[2].parent = (QObject *)CONCAT44(local_48.context.line,local_48.context.version);
      pQVar1[2].children.d.d =
           (Data *)CONCAT44(local_48.context.file._4_4_,local_48.context.file._0_4_);
      local_48.context.version = (int)pQVar3;
      local_48.context.line = (int)((ulong)pQVar3 >> 0x20);
      local_48.context.file._0_4_ = SUB84(pDVar4,0);
      local_48.context.file._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
      ppQVar2 = pQVar1[2].children.d.ptr;
      pQVar1[2].children.d.ptr =
           (QObject **)CONCAT44(local_48.context.function._4_4_,local_48.context.function._0_4_);
      local_48.context.function._0_4_ = SUB84(ppQVar2,0);
      local_48.context.function._4_4_ = (undefined4)((ulong)ppQVar2 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      pQVar1[2].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 6;
      bVar5 = false;
      goto LAB_00208905;
    }
    pQVar1[2].field_0x30 = 1;
  }
  bVar5 = true;
LAB_00208905:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemory::lock()
{
    Q_D(QSharedMemory);
    if (d->lockedByMe) {
        qWarning("QSharedMemory::lock: already locked");
        return true;
    }
    if (d->systemSemaphore.acquire()) {
        d->lockedByMe = true;
        return true;
    }
    const auto function = "QSharedMemory::lock"_L1;
    d->errorString = QSharedMemory::tr("%1: unable to lock").arg(function);
    d->error = QSharedMemory::LockError;
    return false;
}